

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RtAudio.cpp
# Opt level: O2

RtAudioErrorType __thiscall RtApiAlsa::stopStream(RtApiAlsa *this)

{
  StreamMutex *__mutex;
  StreamState SVar1;
  undefined8 *puVar2;
  RtAudioErrorType type;
  int iVar3;
  StreamMode SVar4;
  ostream *poVar5;
  char *pcVar6;
  string asStack_48 [32];
  
  SVar1 = (this->super_RtApi).stream_.state;
  if (1 < (uint)(SVar1 + ~STREAM_STOPPED)) {
    if ((SVar1 == STREAM_STOPPED) || (SVar1 == STREAM_CLOSED)) {
      std::__cxx11::string::assign((char *)&(this->super_RtApi).errorText_);
    }
    type = RTAUDIO_WARNING;
    goto LAB_0010e901;
  }
  (this->super_RtApi).stream_.state = STREAM_STOPPED;
  __mutex = &(this->super_RtApi).stream_.mutex;
  pthread_mutex_lock((pthread_mutex_t *)__mutex);
  puVar2 = (undefined8 *)(this->super_RtApi).stream_.apiHandle;
  SVar4 = (this->super_RtApi).stream_.mode;
  if ((SVar4 & ~DUPLEX) == OUTPUT) {
    if (*(char *)(puVar2 + 2) == '\x01') {
      iVar3 = snd_pcm_drop();
    }
    else {
      iVar3 = snd_pcm_drain(*puVar2);
    }
    if (-1 < iVar3) {
      SVar4 = (this->super_RtApi).stream_.mode;
      goto LAB_0010e91f;
    }
    pcVar6 = "RtApiAlsa::stopStream: error draining output pcm device, ";
  }
  else {
LAB_0010e91f:
    if (((1 < (uint)(SVar4 + ~OUTPUT)) || (*(char *)(puVar2 + 2) != '\0')) ||
       (iVar3 = snd_pcm_drop(puVar2[1]), -1 < iVar3)) {
      *(undefined1 *)(puVar2 + 9) = 0;
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      return RTAUDIO_NO_ERROR;
    }
    pcVar6 = "RtApiAlsa::stopStream: error stopping input pcm device, ";
  }
  poVar5 = std::operator<<((ostream *)&(this->super_RtApi).errorStream_,pcVar6);
  pcVar6 = (char *)snd_strerror(iVar3);
  poVar5 = std::operator<<(poVar5,pcVar6);
  std::operator<<(poVar5,".");
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&(this->super_RtApi).errorText_,asStack_48);
  std::__cxx11::string::~string(asStack_48);
  *(undefined1 *)(puVar2 + 9) = 0;
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  type = RTAUDIO_SYSTEM_ERROR;
LAB_0010e901:
  RtApi::error(&this->super_RtApi,type);
  return type;
}

Assistant:

RtAudioErrorType RtApiAlsa :: stopStream()
{
  if ( stream_.state != STREAM_RUNNING && stream_.state != STREAM_STOPPING ) {
    if ( stream_.state == STREAM_STOPPED )
      errorText_ = "RtApiAlsa::stopStream(): the stream is already stopped!";
    else if ( stream_.state == STREAM_CLOSED )
      errorText_ = "RtApiAlsa::stopStream(): the stream is closed!";
    return error( RTAUDIO_WARNING );
  }

  stream_.state = STREAM_STOPPED;
  MUTEX_LOCK( &stream_.mutex );

  int result = 0;
  AlsaHandle *apiInfo = (AlsaHandle *) stream_.apiHandle;
  snd_pcm_t **handle = (snd_pcm_t **) apiInfo->handles;
  if ( stream_.mode == OUTPUT || stream_.mode == DUPLEX ) {
    if ( apiInfo->synchronized ) 
      result = snd_pcm_drop( handle[0] );
    else
      result = snd_pcm_drain( handle[0] );
    if ( result < 0 ) {
      errorStream_ << "RtApiAlsa::stopStream: error draining output pcm device, " << snd_strerror( result ) << ".";
      errorText_ = errorStream_.str();
      goto unlock;
    }
  }

  if ( ( stream_.mode == INPUT || stream_.mode == DUPLEX ) && !apiInfo->synchronized ) {
    result = snd_pcm_drop( handle[1] );
    if ( result < 0 ) {
      errorStream_ << "RtApiAlsa::stopStream: error stopping input pcm device, " << snd_strerror( result ) << ".";
      errorText_ = errorStream_.str();
      goto unlock;
    }
  }

 unlock:
  apiInfo->runnable = false; // fixes high CPU usage when stopped
  MUTEX_UNLOCK( &stream_.mutex );

  if ( result < 0 ) return error( RTAUDIO_SYSTEM_ERROR );
  return RTAUDIO_NO_ERROR;
}